

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O3

float max_elem(float *arr,int length)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  
  if (1 < length) {
    uVar1 = 1;
    fVar3 = *arr;
    do {
      fVar2 = arr[uVar1];
      if (arr[uVar1] <= fVar3) {
        fVar2 = fVar3;
      }
      uVar1 = uVar1 + 1;
      fVar3 = fVar2;
    } while ((uint)length != uVar1);
    return fVar2;
  }
  return *arr;
}

Assistant:

float max_elem(float* arr, int length)
{
  float max = arr[0];
  for (int i = 1; i < length; i++)
    if (arr[i] > max)
      max = arr[i];
  return max;
}